

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O0

void Saig_ManMarkCone_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  if ((pObj != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsTravIdCurrent(p,pObj), iVar1 == 0)) {
    Aig_ObjSetTravIdCurrent(p,pObj);
    pAVar2 = Aig_ObjFanin0(pObj);
    Saig_ManMarkCone_rec(p,pAVar2);
    pAVar2 = Aig_ObjFanin1(pObj);
    Saig_ManMarkCone_rec(p,pAVar2);
  }
  return;
}

Assistant:

void Saig_ManMarkCone_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    if ( pObj == NULL )
        return;
    if ( Aig_ObjIsTravIdCurrent( p, pObj ) )
        return;
    Aig_ObjSetTravIdCurrent( p, pObj );
    Saig_ManMarkCone_rec( p, Aig_ObjFanin0(pObj) );
    Saig_ManMarkCone_rec( p, Aig_ObjFanin1(pObj) );
}